

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReduceL1LayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_reducel1(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ReduceL1LayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_reducel1(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reducel1(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ReduceL1LayerParams>(arena);
    (this->layer_).reducel1_ = pRVar2;
  }
  return (ReduceL1LayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReduceL1LayerParams* NeuralNetworkLayer::_internal_mutable_reducel1() {
  if (!_internal_has_reducel1()) {
    clear_layer();
    set_has_reducel1();
    layer_.reducel1_ = CreateMaybeMessage< ::CoreML::Specification::ReduceL1LayerParams >(GetArenaForAllocation());
  }
  return layer_.reducel1_;
}